

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

reference __thiscall
duckdb::vector<duckdb::shared_ptr<duckdb::VectorBuffer,_true>,_true>::operator[]
          (vector<duckdb::shared_ptr<duckdb::VectorBuffer,_true>,_true> *this,size_type __n)

{
  pointer psVar1;
  InternalException *this_00;
  ulong params_1;
  string local_48;
  
  psVar1 = (this->
           super_vector<duckdb::shared_ptr<duckdb::VectorBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>
           ).
           super__Vector_base<duckdb::shared_ptr<duckdb::VectorBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  params_1 = (long)(this->
                   super_vector<duckdb::shared_ptr<duckdb::VectorBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>
                   ).
                   super__Vector_base<duckdb::shared_ptr<duckdb::VectorBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4;
  if (__n < params_1) {
    return psVar1 + __n;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Attempted to access index %ld within vector of size %ld","");
  InternalException::InternalException<unsigned_long,unsigned_long>(this_00,&local_48,__n,params_1);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

typename original::reference operator[](typename original::size_type __n) { // NOLINT: hiding on purpose
		return get<SAFE>(__n);
	}